

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchcache.hpp
# Opt level: O0

void __thiscall
CorUnix::CSynchCache<CorUnix::CSynchWaitController>::~CSynchCache
          (CSynchCache<CorUnix::CSynchWaitController> *this)

{
  CSynchCache<CorUnix::CSynchWaitController> *this_local;
  
  Flush(this,(CPalThread *)0x0,true);
  InternalDeleteCriticalSection(&this->m_cs);
  return;
}

Assistant:

~CSynchCache()
        {        
            Flush(NULL, true);
            InternalDeleteCriticalSection(&m_cs); 
        }